

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetRetryPolicy
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_CLIENT_RETRY_POLICY retryPolicy,
          size_t retryTimeoutLimitInSeconds)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_RESULT IVar3;
  char *pcVar4;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    iVar1 = 0x8a1;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[1];
  }
  else if (iotHubClientHandle->transportHandle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    IVar3 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    iVar1 = 0x8a8;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[2];
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_SetRetryPolicy)
                      (iotHubClientHandle->transportHandle,retryPolicy,retryTimeoutLimitInSeconds);
    if (iVar1 == 0) {
      iotHubClientHandle->retryPolicy = retryPolicy;
      iotHubClientHandle->retryTimeoutLimitInSeconds = retryTimeoutLimitInSeconds;
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar3 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    iVar1 = 0x8af;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[2];
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_SetRetryPolicy",iVar1,1,"result = %s",pcVar4);
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetRetryPolicy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_RETRY_POLICY retryPolicy, size_t retryTimeoutLimitInSeconds)
{
    IOTHUB_CLIENT_RESULT result;
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

    if (handleData == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        if (handleData->transportHandle == NULL)
        {
            result = IOTHUB_CLIENT_ERROR;
            LOG_ERROR_RESULT;
        }
        else
        {
            if (handleData->IoTHubTransport_SetRetryPolicy(handleData->transportHandle, retryPolicy, retryTimeoutLimitInSeconds) != 0)
            {
                result = IOTHUB_CLIENT_ERROR;
                LOG_ERROR_RESULT;
            }
            else
            {
                handleData->retryPolicy = retryPolicy;
                handleData->retryTimeoutLimitInSeconds = retryTimeoutLimitInSeconds;
                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;
}